

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * __thiscall cmGeneratorTarget::GetLinkPIEProperty(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  PolicyStatus PVar2;
  int iVar3;
  _Alloc_hider _Var4;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  if ((GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetLinkPIEProperty(std::__cxx11::string_const&)::
                                   PICValue_abi_cxx11_), iVar3 != 0)) {
    GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_.field_2;
    GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_._M_string_length = 0;
    GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_.field_2._M_local_buf[0] =
         '\0';
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"POSITION_INDEPENDENT_CODE",&local_59);
  GetLinkInterfaceDependentStringAsBoolProperty(&local_38,this,&local_58,config);
  std::__cxx11::string::operator=
            ((string *)&GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_,
             (string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = std::operator==(&GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_,
                          "(unset)");
  if ((bVar1) ||
     (PVar2 = GetPolicyStatusCMP0083(this),
     _Var4 = GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_._M_dataplus,
     PVar2 < NEW)) {
    _Var4._M_p = (char *)0x0;
  }
  return _Var4._M_p;
}

Assistant:

const char* cmGeneratorTarget::GetLinkPIEProperty(
  const std::string& config) const
{
  static std::string PICValue;

  PICValue = this->GetLinkInterfaceDependentStringAsBoolProperty(
    "POSITION_INDEPENDENT_CODE", config);

  if (PICValue == "(unset)") {
    // POSITION_INDEPENDENT_CODE is not set
    return nullptr;
  }

  auto status = this->GetPolicyStatusCMP0083();
  return (status != cmPolicies::WARN && status != cmPolicies::OLD)
    ? PICValue.c_str()
    : nullptr;
}